

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.c
# Opt level: O1

void build_tree(deflate_state *s,tree_desc *desc)

{
  uint uVar1;
  uint16_t *bl_count;
  ushort uVar2;
  ushort uVar3;
  int iVar4;
  int iVar5;
  ct_data *tree;
  ct_data *pcVar6;
  static_tree_desc *psVar7;
  ct_data *pcVar8;
  int *piVar9;
  bool bVar10;
  ulong uVar11;
  byte bVar12;
  uint uVar13;
  ulong uVar14;
  int iVar15;
  long lVar16;
  int iVar17;
  uint uVar18;
  int iVar19;
  uint16_t *puVar20;
  unsigned_long uVar21;
  int iVar22;
  ulong uVar23;
  
  tree = desc->dyn_tree;
  pcVar6 = desc->stat_desc->static_tree;
  uVar14 = (ulong)desc->stat_desc->elems;
  s->heap_len = 0;
  s->heap_max = 0x23d;
  uVar23 = 0xffffffff;
  if (0 < (long)uVar14) {
    uVar11 = 0;
    do {
      if (tree[uVar11].fc.freq == 0) {
        tree[uVar11].dl.dad = 0;
      }
      else {
        iVar22 = s->heap_len;
        s->heap_len = iVar22 + 1;
        s->heap[(long)iVar22 + 1] = (int)uVar11;
        s->depth[uVar11] = '\0';
        uVar23 = uVar11 & 0xffffffff;
      }
      uVar11 = uVar11 + 1;
    } while (uVar14 != uVar11);
  }
  iVar22 = (int)uVar23;
  uVar18 = s->heap_len;
  while ((int)uVar18 < 2) {
    iVar4 = (int)uVar23;
    uVar13 = iVar4 + 1;
    if (iVar4 < 2) {
      uVar23 = (ulong)uVar13;
    }
    iVar22 = (int)uVar23;
    if (1 < iVar4) {
      uVar13 = 0;
    }
    s->heap_len = uVar18 + 1;
    s->heap[(long)(int)uVar18 + 1] = uVar13;
    tree[(int)uVar13].fc.freq = 1;
    s->depth[(int)uVar13] = '\0';
    s->opt_len = s->opt_len - 1;
    if (pcVar6 != (ct_data *)0x0) {
      s->static_len = s->static_len - (ulong)pcVar6[(int)uVar13].dl.dad;
    }
    uVar18 = s->heap_len;
  }
  desc->max_code = iVar22;
  if (1 < uVar18) {
    uVar18 = uVar18 >> 1;
    do {
      pqdownheap(s,tree,uVar18);
      bVar10 = 1 < (int)uVar18;
      uVar18 = uVar18 - 1;
    } while (bVar10);
  }
  do {
    iVar4 = s->heap[1];
    iVar5 = s->heap_len;
    s->heap_len = iVar5 + -1;
    s->heap[1] = s->heap[iVar5];
    pqdownheap(s,tree,1);
    iVar5 = s->heap[1];
    iVar15 = s->heap_max;
    s->heap_max = iVar15 + -1;
    s->heap[(long)iVar15 + -1] = iVar4;
    iVar15 = s->heap_max;
    s->heap_max = iVar15 + -1;
    s->heap[(long)iVar15 + -1] = iVar5;
    tree[uVar14].fc.freq = tree[iVar5].fc.freq + tree[iVar4].fc.freq;
    bVar12 = s->depth[iVar5];
    if (s->depth[iVar5] < s->depth[iVar4]) {
      bVar12 = s->depth[iVar4];
    }
    s->depth[uVar14] = bVar12 + 1;
    tree[iVar5].dl.dad = (uint16_t)uVar14;
    tree[iVar4].dl.dad = (uint16_t)uVar14;
    s->heap[1] = (int)uVar14;
    pqdownheap(s,tree,1);
    uVar14 = uVar14 + 1;
  } while (1 < s->heap_len);
  iVar4 = s->heap[1];
  iVar5 = s->heap_max;
  s->heap_max = iVar5 + -1;
  s->heap[(long)iVar5 + -1] = iVar4;
  pcVar6 = desc->dyn_tree;
  iVar4 = desc->max_code;
  psVar7 = desc->stat_desc;
  pcVar8 = psVar7->static_tree;
  piVar9 = psVar7->extra_bits;
  iVar5 = psVar7->extra_base;
  uVar18 = psVar7->max_length;
  uVar23 = (ulong)uVar18;
  bl_count = s->bl_count;
  s->bl_count[8] = 0;
  s->bl_count[9] = 0;
  s->bl_count[10] = 0;
  s->bl_count[0xb] = 0;
  s->bl_count[0xc] = 0;
  s->bl_count[0xd] = 0;
  s->bl_count[0xe] = 0;
  s->bl_count[0xf] = 0;
  s->bl_count[0] = 0;
  s->bl_count[1] = 0;
  s->bl_count[2] = 0;
  s->bl_count[3] = 0;
  s->bl_count[4] = 0;
  s->bl_count[5] = 0;
  s->bl_count[6] = 0;
  s->bl_count[7] = 0;
  pcVar6[s->heap[s->heap_max]].dl.dad = 0;
  iVar15 = s->heap_max;
  if ((long)iVar15 < 0x23c) {
    iVar17 = 0;
    lVar16 = (long)iVar15;
    do {
      iVar15 = s->heap[lVar16 + 1];
      uVar2 = pcVar6[pcVar6[iVar15].dl.dad].dl.dad;
      uVar13 = uVar18;
      if (uVar2 < uVar18) {
        uVar13 = uVar2 + 1;
      }
      pcVar6[iVar15].dl.dad = (uint16_t)uVar13;
      if (iVar15 <= iVar4) {
        bl_count[uVar13] = bl_count[uVar13] + 1;
        iVar19 = 0;
        if (iVar5 <= iVar15) {
          iVar19 = piVar9[iVar15 - iVar5];
        }
        uVar3 = pcVar6[iVar15].fc.freq;
        s->opt_len = s->opt_len + (ulong)(uVar13 + iVar19) * (ulong)uVar3;
        if (pcVar8 != (ct_data *)0x0) {
          s->static_len =
               s->static_len + (ulong)(iVar19 + (uint)pcVar8[iVar15].dl.dad) * (ulong)uVar3;
        }
      }
      iVar17 = iVar17 + (uint)(uVar18 <= uVar2);
      iVar15 = (int)lVar16;
      lVar16 = lVar16 + 1;
    } while (iVar15 != 0x23b);
    iVar15 = 0x23d;
  }
  else {
    iVar15 = iVar15 + 1;
    iVar17 = 0;
  }
  if (iVar17 != 0) {
    uVar13 = uVar18 + 1;
    do {
      do {
        uVar1 = uVar13 - 2;
        uVar13 = uVar13 - 1;
      } while (bl_count[uVar1] == 0);
      bl_count[uVar1] = bl_count[uVar1] - 1;
      bl_count[uVar13] = bl_count[uVar13] + 2;
      bl_count[uVar23] = bl_count[uVar23] - 1;
      bVar10 = 2 < iVar17;
      uVar13 = uVar18 + 1;
      iVar17 = iVar17 + -2;
    } while (bVar10);
    if (uVar23 != 0) {
      do {
        uVar18 = (uint)bl_count[uVar23];
        if (bl_count[uVar23] != 0) {
          do {
            puVar20 = (uint16_t *)(s->heap + (long)iVar15 + -1);
            do {
              iVar5 = *(int *)puVar20;
              iVar15 = iVar15 + -1;
              puVar20 = puVar20 + -2;
            } while (iVar4 < iVar5);
            if (uVar23 != pcVar6[iVar5].dl.dad) {
              uVar21 = (ulong)((uint)pcVar6[iVar5].fc.freq * (int)uVar23) + s->opt_len;
              s->opt_len = uVar21;
              s->opt_len = uVar21 - (ulong)pcVar6[iVar5].fc.freq * (ulong)pcVar6[iVar5].dl.dad;
              pcVar6[iVar5].dl.dad = (uint16_t)uVar23;
            }
            uVar18 = uVar18 - 1;
          } while (uVar18 != 0);
        }
        uVar23 = uVar23 - 1;
      } while ((int)uVar23 != 0);
    }
  }
  gen_codes(tree,iVar22,bl_count);
  return;
}

Assistant:

static void build_tree(deflate_state *s, tree_desc *desc) {
    /* desc: the tree descriptor */
    ct_data *tree         = desc->dyn_tree;
    const ct_data *stree  = desc->stat_desc->static_tree;
    int elems             = desc->stat_desc->elems;
    int n, m;          /* iterate over heap elements */
    int max_code = -1; /* largest code with non zero frequency */
    int node;          /* new node being created */

    /* Construct the initial heap, with least frequent element in
     * heap[SMALLEST]. The sons of heap[n] are heap[2*n] and heap[2*n+1].
     * heap[0] is not used.
     */
    s->heap_len = 0;
    s->heap_max = HEAP_SIZE;

    for (n = 0; n < elems; n++) {
        if (tree[n].Freq != 0) {
            s->heap[++(s->heap_len)] = max_code = n;
            s->depth[n] = 0;
        } else {
            tree[n].Len = 0;
        }
    }

    /* The pkzip format requires that at least one distance code exists,
     * and that at least one bit should be sent even if there is only one
     * possible code. So to avoid special checks later on we force at least
     * two codes of non zero frequency.
     */
    while (s->heap_len < 2) {
        node = s->heap[++(s->heap_len)] = (max_code < 2 ? ++max_code : 0);
        tree[node].Freq = 1;
        s->depth[node] = 0;
        s->opt_len--;
        if (stree)
            s->static_len -= stree[node].Len;
        /* node is 0 or 1 so it does not have extra bits */
    }
    desc->max_code = max_code;

    /* The elements heap[heap_len/2+1 .. heap_len] are leaves of the tree,
     * establish sub-heaps of increasing lengths:
     */
    for (n = s->heap_len/2; n >= 1; n--)
        pqdownheap(s, tree, n);

    /* Construct the Huffman tree by repeatedly combining the least two
     * frequent nodes.
     */
    node = elems;              /* next internal node of the tree */
    do {
        pqremove(s, tree, n);  /* n = node of least frequency */
        m = s->heap[SMALLEST]; /* m = node of next least frequency */

        s->heap[--(s->heap_max)] = n; /* keep the nodes sorted by frequency */
        s->heap[--(s->heap_max)] = m;

        /* Create a new node father of n and m */
        tree[node].Freq = tree[n].Freq + tree[m].Freq;
        s->depth[node] = (unsigned char)((s->depth[n] >= s->depth[m] ?
                                          s->depth[n] : s->depth[m]) + 1);
        tree[n].Dad = tree[m].Dad = (uint16_t)node;
#ifdef DUMP_BL_TREE
        if (tree == s->bl_tree) {
            fprintf(stderr, "\nnode %d(%d), sons %d(%d) %d(%d)",
                    node, tree[node].Freq, n, tree[n].Freq, m, tree[m].Freq);
        }
#endif
        /* and insert the new node in the heap */
        s->heap[SMALLEST] = node++;
        pqdownheap(s, tree, SMALLEST);
    } while (s->heap_len >= 2);

    s->heap[--(s->heap_max)] = s->heap[SMALLEST];

    /* At this point, the fields freq and dad are set. We can now
     * generate the bit lengths.
     */
    gen_bitlen(s, (tree_desc *)desc);

    /* The field len is now set, we can generate the bit codes */
    gen_codes((ct_data *)tree, max_code, s->bl_count);
}